

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O1

pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *
adios2::utils::get_local_array_signature<long_double>
          (pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           *__return_storage_ptr__,Engine *fp,IO *io,Variable<long_double> *variable)

{
  long lVar1;
  _Base_ptr p_Var2;
  pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *ppVar3;
  iterator __begin5;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  bool bVar9;
  long *plVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  size_type __n;
  ulong uVar15;
  Dims dims;
  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
  blocks;
  allocator_type local_89;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  Engine *local_70;
  pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *local_68;
  undefined1 local_60 [24];
  _Rb_tree_node_base *local_48;
  
  lVar6 = *(long *)(variable + 0x88);
  lVar1 = *(long *)(variable + 0x90);
  __n = lVar1 - lVar6 >> 3;
  local_60._0_8_ = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_88,__n,(value_type_conflict1 *)local_60,&local_89);
  local_68 = __return_storage_ptr__;
  if (timestep == '\x01') {
    uVar4 = (**(code **)(*(long *)fp + 0x20))(fp);
    lVar5 = (**(code **)(*(long *)fp + 0x58))(fp,variable,uVar4);
    if (lVar5 == 0) {
      (**(code **)(*(long *)fp + 0x20))(fp);
      adios2::core::Engine::BlocksInfo<long_double>((Variable *)local_60,(ulong)fp);
      if (local_60._0_8_ == local_60._8_8_) {
        uVar8 = 0;
      }
      else {
        uVar8 = ((long)(local_60._8_8_ - local_60._0_8_) >> 6) * 0x6db6db6db6db6db7;
        bVar9 = true;
        lVar5 = 0;
        do {
          if (lVar1 != lVar6) {
            lVar13 = 0;
            do {
              if (bVar9) {
                local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar13] =
                     (((pointer)(local_60._0_8_ + lVar5 * 0x1c0))->Count).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar13];
              }
              else if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar13] !=
                       (((pointer)(local_60._0_8_ + lVar5 * 0x1c0))->Count).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar13]) {
                local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar13] = 0;
              }
              lVar13 = lVar13 + 1;
            } while (__n + (__n == 0) != lVar13);
          }
          lVar5 = lVar5 + 1;
          bVar9 = false;
        } while (lVar5 != uVar8 + (uVar8 == 0));
      }
      std::
      vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                 *)local_60);
    }
    else {
      lVar13 = *(long *)(lVar5 + 0x20);
      uVar8 = (*(long *)(lVar5 + 0x28) - lVar13 >> 4) * -0x3333333333333333;
      if (*(long *)(lVar5 + 0x28) != lVar13) {
        bVar9 = true;
        lVar5 = 0;
        do {
          if (lVar1 != lVar6) {
            plVar10 = (long *)(lVar5 * 0x50 + lVar13 + 0x18);
            lVar11 = 0;
            do {
              if (bVar9) {
                local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11] = *(unsigned_long *)(*plVar10 + lVar11 * 8)
                ;
              }
              else if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar11] !=
                       *(unsigned_long *)(*plVar10 + lVar11 * 8)) {
                local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11] = 0;
              }
              lVar11 = lVar11 + 1;
            } while (__n + (__n == 0) != lVar11);
          }
          lVar5 = lVar5 + 1;
          bVar9 = false;
        } while (lVar5 != uVar8 + (uVar8 == 0));
      }
    }
  }
  else {
    local_70 = fp;
    lVar5 = (**(code **)(*(long *)fp + 0x58))(fp,variable,0);
    if (lVar5 == 0) {
      adios2::core::Engine::AllStepsBlocksInfo<long_double>((Variable *)local_60);
      if (local_48 == (_Rb_tree_node_base *)(local_60 + 8)) {
        uVar8 = 0;
      }
      else {
        bVar14 = true;
        bVar9 = true;
        uVar8 = 0;
        do {
          p_Var2 = local_48[1]._M_parent;
          uVar7 = ((long)local_48[1]._M_left - (long)p_Var2 >> 6) * 0x6db6db6db6db6db7;
          if (uVar8 != uVar7) {
            uVar8 = 0;
          }
          if (bVar9) {
            uVar8 = uVar7;
          }
          if (local_48[1]._M_left != p_Var2) {
            lVar5 = 0;
            do {
              if (lVar1 != lVar6) {
                lVar13 = 0;
                do {
                  if (bVar14) {
                    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar13] =
                         *(unsigned_long *)(*(long *)(p_Var2 + lVar5 * 0xe + 3) + lVar13 * 8);
                  }
                  else if (local_88.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[lVar13] !=
                           *(unsigned_long *)(*(long *)(p_Var2 + lVar5 * 0xe + 3) + lVar13 * 8)) {
                    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar13] = 0;
                  }
                  lVar13 = lVar13 + 1;
                } while (__n + (__n == 0) != lVar13);
              }
              lVar5 = lVar5 + 1;
              bVar14 = false;
            } while (lVar5 != uVar7 + (uVar7 == 0));
          }
          local_48 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_48);
          bVar9 = false;
        } while (local_48 != (_Rb_tree_node_base *)(local_60 + 8));
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>_>_>
                   *)local_60);
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&local_88,(long)*(int *)(lVar5 + 0xc));
      if (*(long *)(variable + 0xf8) == 0) {
        uVar8 = 0;
      }
      else {
        bVar9 = true;
        uVar15 = 0;
        bVar14 = true;
        uVar8 = 0;
        do {
          if (uVar15 != 0) {
            lVar5 = (**(code **)(*(long *)local_70 + 0x58))(local_70,variable,uVar15);
          }
          lVar6 = *(long *)(lVar5 + 0x20);
          lVar1 = *(long *)(lVar5 + 0x28);
          uVar7 = (lVar1 - lVar6 >> 4) * -0x3333333333333333;
          if (uVar8 != uVar7) {
            uVar8 = 0;
          }
          if (bVar14) {
            uVar8 = uVar7;
          }
          if (lVar1 != lVar6) {
            lVar13 = (long)local_88.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_88.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3;
            lVar13 = lVar13 + (ulong)(lVar13 == 0);
            do {
              if (bVar9) {
                if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar11 = *(long *)(lVar6 + 0x18);
                  lVar12 = 0;
                  do {
                    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar12] =
                         *(unsigned_long *)(lVar11 + lVar12 * 8);
                    lVar12 = lVar12 + 1;
                  } while (lVar13 != lVar12);
                }
              }
              else if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish !=
                       local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start) {
                lVar11 = *(long *)(lVar6 + 0x18);
                lVar12 = 0;
                do {
                  if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar12] !=
                      *(unsigned_long *)(lVar11 + lVar12 * 8)) {
                    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar12] = 0;
                  }
                  lVar12 = lVar12 + 1;
                } while (lVar13 != lVar12);
              }
              lVar6 = lVar6 + 0x50;
              bVar9 = false;
            } while (lVar6 != lVar1);
          }
          uVar15 = uVar15 + 1;
          bVar14 = false;
        } while (uVar15 < *(ulong *)(variable + 0xf8));
      }
    }
  }
  ppVar3 = local_68;
  local_68->first = uVar8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_68->second,&local_88);
  if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return ppVar3;
}

Assistant:

std::pair<size_t, Dims> get_local_array_signature(core::Engine *fp, core::IO *io,
                                                  core::Variable<T> *variable)
{
    const size_t ndim = variable->m_Count.size();
    size_t nblocks = 0;
    Dims dims(ndim, 0);

    if (timestep)
    {
        const auto minBlocks = fp->MinBlocksInfo(*variable, fp->CurrentStep());

        if (minBlocks)
        {
            bool firstBlock = true;
            nblocks = minBlocks->BlocksInfo.size();
            for (size_t j = 0; j < nblocks; j++)
            {
                for (size_t k = 0; k < ndim; k++)
                {
                    if (firstBlock)
                    {
                        dims[k] = minBlocks->BlocksInfo[j].Count[k];
                    }
                    else if (dims[k] != minBlocks->BlocksInfo[j].Count[k])
                    {
                        dims[k] = 0;
                    }
                }
                firstBlock = false;
            }
        }
        else
        {
            std::vector<typename core::Variable<T>::BPInfo> blocks =
                fp->BlocksInfo(*variable, fp->CurrentStep());
            if (!blocks.empty())
            {
                nblocks = blocks.size();
                bool firstBlock = true;
                for (size_t j = 0; j < nblocks; j++)
                {
                    for (size_t k = 0; k < ndim; k++)
                    {
                        if (firstBlock)
                        {
                            dims[k] = blocks[j].Count[k];
                        }
                        else if (dims[k] != blocks[j].Count[k])
                        {
                            dims[k] = 0;
                        }
                    }
                    firstBlock = false;
                }
            }
        }
    }
    else
    {
        bool firstStep = true;
        bool firstBlock = true;

        MinVarInfo *minBlocksInfo = nullptr;
        minBlocksInfo = fp->MinBlocksInfo(*variable, 0 /* relative step 0 */);

        // first step
        if (minBlocksInfo)
        {
            dims.resize(minBlocksInfo->Dims);
            size_t RelStep = 0;
            for (RelStep = 0; RelStep < variable->m_AvailableStepsCount; RelStep++)
            {
                if (RelStep > 0)
                {
                    minBlocksInfo = fp->MinBlocksInfo(*variable, RelStep);
                }

                auto &coreBlocksInfo = minBlocksInfo->BlocksInfo;
                if (firstStep)
                {
                    nblocks = coreBlocksInfo.size();
                }
                else if (nblocks != coreBlocksInfo.size())
                {
                    nblocks = 0;
                }
                for (auto &coreBlockInfo : coreBlocksInfo)
                {
                    if (firstBlock)
                    {
                        for (size_t k = 0; k < dims.size(); k++)
                        {
                            dims[k] = coreBlockInfo.Count[k];
                        }
                    }
                    else
                    {
                        for (size_t k = 0; k < dims.size(); k++)
                        {
                            if (dims[k] != coreBlockInfo.Count[k])
                            {
                                dims[k] = 0;
                            }
                        }
                    }
                    firstBlock = false;
                }
                firstStep = false;
            }
        }
        else
        {
            std::map<size_t, std::vector<typename core::Variable<T>::BPInfo>> allblocks =
                fp->AllStepsBlocksInfo(*variable);

            for (auto &blockpair : allblocks)
            {
                std::vector<typename adios2::core::Variable<T>::BPInfo> &blocks = blockpair.second;
                const size_t blocksSize = blocks.size();
                if (firstStep)
                {
                    nblocks = blocksSize;
                }
                else if (nblocks != blocksSize)
                {
                    nblocks = 0;
                }

                for (size_t j = 0; j < blocksSize; j++)
                {
                    for (size_t k = 0; k < ndim; k++)
                    {
                        if (firstBlock)
                        {
                            dims[k] = blocks[j].Count[k];
                        }
                        else if (dims[k] != blocks[j].Count[k])
                        {
                            dims[k] = 0;
                        }
                    }
                    firstBlock = false;
                }
                firstStep = false;
            }
        }
    }
    return std::make_pair(nblocks, dims);
}